

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_game.cc
# Opt level: O0

int __thiscall
hanabi_learning_env::HanabiGame::GetMoveUid
          (HanabiGame *this,Type move_type,int card_index,int target_offset,int color,int rank)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  HanabiGame *in_RDI;
  int in_R8D;
  int in_R9D;
  int local_4;
  
  switch(in_ESI) {
  case 1:
    local_4 = MaxDiscardMoves(in_RDI);
    local_4 = local_4 + in_EDX;
    break;
  case 2:
    local_4 = in_EDX;
    break;
  case 3:
    iVar1 = MaxDiscardMoves(in_RDI);
    iVar2 = MaxPlayMoves(in_RDI);
    iVar3 = NumColors(in_RDI);
    local_4 = iVar1 + iVar2 + (in_ECX + -1) * iVar3 + in_R8D;
    break;
  case 4:
    iVar1 = MaxDiscardMoves(in_RDI);
    iVar2 = MaxPlayMoves(in_RDI);
    iVar3 = MaxRevealColorMoves(in_RDI);
    iVar4 = NumRanks(in_RDI);
    local_4 = iVar1 + iVar2 + iVar3 + (in_ECX + -1) * iVar4 + in_R9D;
    break;
  default:
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int HanabiGame::GetMoveUid(HanabiMove::Type move_type, int card_index,
                           int target_offset, int color, int rank) const {
  switch (move_type) {
    case HanabiMove::kDiscard:
      return card_index;
    case HanabiMove::kPlay:
      return MaxDiscardMoves() + card_index;
    case HanabiMove::kRevealColor:
      return MaxDiscardMoves() + MaxPlayMoves() +
             (target_offset - 1) * NumColors() + color;
    case HanabiMove::kRevealRank:
      return MaxDiscardMoves() + MaxPlayMoves() + MaxRevealColorMoves() +
             (target_offset - 1) * NumRanks() + rank;
    default:
      return -1;
  }
}